

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O2

float ldamath::fastpow2(float p)

{
  float fVar1;
  float fVar2;
  
  fVar1 = -126.0;
  if (-126.0 <= p) {
    fVar1 = p;
  }
  fVar2 = (fVar1 - (float)(int)fVar1) + (float)(-(uint)(p < 0.0) & 0x3f800000);
  return (float)(long)((fVar2 * -1.4901291 + 27.728024 / (4.8425255 - fVar2) + fVar1 + 121.274086) *
                      8388608.0);
}

Assistant:

inline float fastpow2(float p)
{
  float offset = (p < 0) * 1.0f;
  float clipp = (p < -126.0) ? -126.0f : p;
  int w = (int)clipp;
  float z = clipp - w + offset;
  uint32_t approx = (uint32_t)((1 << 23) * (clipp + 121.2740838f + 27.7280233f / (4.84252568f - z) - 1.49012907f * z));

  float v;
  memcpy(&v, &approx, sizeof(uint32_t));
  return v;
}